

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O2

void Cec_GiaSplitClean(Vec_Ptr_t *vStack)

{
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 < vStack->nSize; lVar1 = lVar1 + 1) {
    Gia_ManStop((Gia_Man_t *)vStack->pArray[lVar1]);
  }
  free(vStack->pArray);
  free(vStack);
  return;
}

Assistant:

static inline void Cec_GiaSplitClean( Vec_Ptr_t * vStack )
{
    Gia_Man_t * pNew;
    int i;
    Vec_PtrForEachEntry( Gia_Man_t *, vStack, pNew, i )
        Gia_ManStop( pNew );
    Vec_PtrFree( vStack );
}